

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int ixxx::posix::open(char *__file,int __oflag,...)

{
  int iVar1;
  open_error *this;
  int *piVar2;
  
  iVar1 = ::open(__file,__oflag);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (open_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  open_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&open_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

int open(const char *pathname, int flags, mode_t mode)
    {
      int r = ::open(pathname, flags
#if (defined(__MINGW32__) || defined(__MINGW64__))
          | _O_BINARY
#endif
          , mode);
      if (r == -1)
        throw open_error(errno);
      return r;
    }